

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void TestLogging(bool check_counts)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  __atomic_base<int> _Var4;
  int64 iVar5;
  int64 iVar6;
  int64 iVar7;
  ostream *poVar8;
  uint *puVar9;
  LogMessageData *pLVar10;
  undefined7 in_register_00000039;
  SendMethod in_R9;
  uint uVar11;
  allocator<char> local_12d;
  undefined4 local_12c;
  char s [6];
  LogMessage outer;
  LogMessage local_b8;
  char const_s [12];
  
  local_12c = (undefined4)CONCAT71(in_register_00000039,check_counts);
  iVar5 = google::LogMessage::num_messages(0);
  iVar6 = google::LogMessage::num_messages(1);
  iVar7 = google::LogMessage::num_messages(2);
  google::LogMessage::LogMessage
            (&outer,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x131);
  poVar8 = google::LogMessage::stream(&outer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"foo ",(allocator<char> *)const_s);
  poVar8 = std::operator<<(poVar8,(string *)&local_b8);
  poVar8 = std::operator<<(poVar8,"bar ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,10);
  std::operator<<(poVar8,' ');
  std::ostream::_M_insert<double>(3.4);
  std::__cxx11::string::~string((string *)&local_b8);
  google::LogMessage::~LogMessage(&outer);
  puVar9 = (uint *)__errno_location();
  for (uVar11 = 0; uVar11 != 10; uVar11 = uVar11 + 1) {
    uVar1 = *puVar9;
    *puVar9 = uVar11;
    LOCK();
    TestLogging::occurrences_309.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_309.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    LOCK();
    UNLOCK();
    _Var4._M_i = (TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i + 1)._M_i;
    if (2 < (int)TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i + 1) {
      LOCK();
      TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i =
           (__atomic_base<int>)
           ((int)TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i + -1);
      UNLOCK();
      _Var4._M_i = (__int_type)TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i;
    }
    TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i =
         (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
    if (TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i == 1) {
      local_b8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_b8.data_ = (LogMessageData *)0x0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x135,ERROR,(long)(int)TestLogging::occurrences_309.super___atomic_base<int>._M_i,
                 in_R9);
      poVar8 = google::LogMessage::stream(&outer);
      poVar8 = std::operator<<(poVar8,"Plog every 2, iteration ");
      google::operator<<(poVar8,(Counter_t *)&google::COUNTER);
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&outer);
    }
    *puVar9 = uVar1;
    LOCK();
    TestLogging::occurrences_312.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_312.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    LOCK();
    UNLOCK();
    _Var4._M_i = (TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i + 1)._M_i;
    if (3 < (int)TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i + 1) {
      LOCK();
      TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i =
           (__atomic_base<int>)
           ((int)TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i + -2);
      UNLOCK();
      _Var4._M_i = (__int_type)TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i;
    }
    TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i =
         (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
    if (TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i == 1) {
      local_b8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_b8.data_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x138,ERROR,(long)(int)TestLogging::occurrences_312.super___atomic_base<int>._M_i,
                 in_R9);
      poVar8 = google::LogMessage::stream(&outer);
      poVar8 = std::operator<<(poVar8,"Log every 3, iteration ");
      poVar8 = google::operator<<(poVar8,(Counter_t *)&google::COUNTER);
      std::endl<char,std::char_traits<char>>(poVar8);
      google::LogMessage::~LogMessage(&outer);
    }
    LOCK();
    TestLogging::occurrences_313.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_313.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    LOCK();
    UNLOCK();
    _Var4._M_i = (TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i + 1)._M_i;
    if (4 < (int)TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i + 1) {
      LOCK();
      TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i =
           (__atomic_base<int>)
           ((int)TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i + -3);
      UNLOCK();
      _Var4._M_i = (__int_type)TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i;
    }
    TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i =
         (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
    if (TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i == 1) {
      local_b8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_b8.data_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x139,ERROR,(long)(int)TestLogging::occurrences_313.super___atomic_base<int>._M_i,
                 in_R9);
      poVar8 = google::LogMessage::stream(&outer);
      poVar8 = std::operator<<(poVar8,"Log every 4, iteration ");
      poVar8 = google::operator<<(poVar8,(Counter_t *)&google::COUNTER);
      std::endl<char,std::char_traits<char>>(poVar8);
      google::LogMessage::~LogMessage(&outer);
    }
    LOCK();
    TestLogging::occurrences_315.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_315.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    TestLogging::occurrences_mod_n_315.super___atomic_base<int>._M_i =
         (__atomic_base<int>)
         (((int)TestLogging::occurrences_mod_n_315.super___atomic_base<int>._M_i + 1) % 5);
    LOCK();
    UNLOCK();
    if (TestLogging::occurrences_mod_n_315.super___atomic_base<int>._M_i == 1) {
      local_b8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_b8.data_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x13b,GLOG_WARNING,
                 (long)(int)TestLogging::occurrences_315.super___atomic_base<int>._M_i,in_R9);
      poVar8 = google::LogMessage::stream(&outer);
      poVar8 = std::operator<<(poVar8,"Log if every 5, iteration ");
      google::operator<<(poVar8,(Counter_t *)&google::COUNTER);
      google::LogMessage::~LogMessage(&outer);
    }
    LOCK();
    TestLogging::occurrences_316.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_316.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    LOCK();
    TestLogging::occurrences_318.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_318.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    local_b8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
    local_b8.data_ = (LogMessageData *)0x0;
    google::LogMessage::LogMessage
              (&outer,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
               ,0x13e,GLOG_INFO,
               (long)(int)TestLogging::occurrences_318.super___atomic_base<int>._M_i,in_R9);
    poVar8 = google::LogMessage::stream(&outer);
    poVar8 = std::operator<<(poVar8,"Log if every 1, iteration ");
    google::operator<<(poVar8,(Counter_t *)&google::COUNTER);
    google::LogMessage::~LogMessage(&outer);
    LOCK();
    TestLogging::occurrences_319.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_319.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    if (uVar11 < 3) {
      TestLogging::occurrences_mod_n_319.super___atomic_base<int>._M_i =
           (__atomic_base<int>)
           (((int)TestLogging::occurrences_mod_n_319.super___atomic_base<int>._M_i + 1) % 2);
      LOCK();
      UNLOCK();
      if (TestLogging::occurrences_mod_n_319.super___atomic_base<int>._M_i == 1) {
        local_b8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
        local_b8.data_ = (LogMessageData *)0x0;
        google::LogMessage::LogMessage
                  (&outer,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x13f,ERROR,
                   (long)(int)TestLogging::occurrences_319.super___atomic_base<int>._M_i,in_R9);
        poVar8 = google::LogMessage::stream(&outer);
        poVar8 = std::operator<<(poVar8,"Log if less than 3 every 2, iteration ");
        google::operator<<(poVar8,(Counter_t *)&google::COUNTER);
        google::LogMessage::~LogMessage(&outer);
      }
    }
  }
  google::LogMessage::LogMessage
            (&outer,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x142,GLOG_WARNING);
  poVar8 = google::LogMessage::stream(&outer);
  std::operator<<(poVar8,"log_if this");
  google::LogMessage::~LogMessage(&outer);
  builtin_strncpy(s,"array",6);
  google::LogMessage::LogMessage
            (&outer,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x146);
  poVar8 = google::LogMessage::stream(&outer);
  std::operator<<(poVar8,s);
  google::LogMessage::~LogMessage(&outer);
  builtin_strncpy(const_s,"const array",0xc);
  google::LogMessage::LogMessage
            (&outer,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x148);
  poVar8 = google::LogMessage::stream(&outer);
  std::operator<<(poVar8,const_s);
  google::LogMessage::~LogMessage(&outer);
  google::LogMessage::LogMessage
            (&outer,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x14a,ERROR);
  poVar8 = google::LogMessage::stream(&outer);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"foo",&local_12d);
  poVar8 = std::operator<<(poVar8,(string *)&local_b8);
  poVar8 = std::operator<<(poVar8,' ');
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,1000);
  poVar8 = std::operator<<(poVar8,' ');
  *(undefined8 *)(&poVar8->field_0x10 + (long)poVar8->_vptr_basic_ostream[-3]) = 10;
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,1000);
  poVar8 = std::operator<<(poVar8," ");
  pp_Var2 = poVar8->_vptr_basic_ostream;
  *(undefined8 *)(&poVar8->field_0x10 + (long)pp_Var2[-3]) = 1;
  p_Var3 = pp_Var2[-3];
  *(uint *)(&poVar8->field_0x18 + (long)p_Var3) =
       *(uint *)(&poVar8->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
  std::ostream::operator<<(poVar8,1000);
  std::__cxx11::string::~string((string *)&local_b8);
  google::LogMessage::~LogMessage(&outer);
  google::LogMessage::LogMessage
            (&outer,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x14c);
  poVar8 = google::LogMessage::stream(&outer);
  poVar8 = std::operator<<(poVar8,"foo ");
  *(undefined8 *)(&poVar8->field_0x10 + (long)poVar8->_vptr_basic_ostream[-3]) = 10;
  std::ostream::_M_insert<double>(1.0);
  google::LogMessage::~LogMessage(&outer);
  google::LogMessage::LogMessage
            (&outer,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x14f,ERROR);
  poVar8 = google::LogMessage::stream(&outer);
  std::operator<<(poVar8,"outer");
  google::LogMessage::LogMessage
            (&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x152,ERROR);
  poVar8 = google::LogMessage::stream(&local_b8);
  std::operator<<(poVar8,"inner");
  google::LogMessage::~LogMessage(&local_b8);
  google::LogMessage::~LogMessage(&outer);
  google::LogMessage::LogMessage(&outer,"foo",-1,GLOG_INFO);
  poVar8 = google::LogMessage::stream(&outer);
  std::operator<<(poVar8,"no prefix");
  google::LogMessage::~LogMessage(&outer);
  if ((char)local_12c == '\0') {
    return;
  }
  outer.allocated_ = (LogMessageData *)(iVar5 + 0xf);
  local_b8.allocated_ = (LogMessageData *)google::LogMessage::num_messages(0);
  pLVar10 = (LogMessageData *)
            google::Check_EQImpl<long,long>
                      ((long *)&outer,(long *)&local_b8,
                       "base_num_infos + 15 == LogMessage::num_messages(GLOG_INFO)");
  if (pLVar10 == (LogMessageData *)0x0) {
    outer.allocated_ = (LogMessageData *)(iVar6 + 3);
    local_b8.allocated_ = (LogMessageData *)google::LogMessage::num_messages(1);
    pLVar10 = (LogMessageData *)
              google::Check_EQImpl<long,long>
                        ((long *)&outer,(long *)&local_b8,
                         "base_num_warning + 3 == LogMessage::num_messages(GLOG_WARNING)");
    if (pLVar10 == (LogMessageData *)0x0) {
      outer.allocated_ = (LogMessageData *)(iVar7 + 0x11);
      local_b8.allocated_ = (LogMessageData *)google::LogMessage::num_messages(2);
      local_b8.allocated_ =
           (LogMessageData *)
           google::Check_EQImpl<long,long>
                     ((long *)&outer,(long *)&local_b8,
                      "base_num_errors + 17 == LogMessage::num_messages(GLOG_ERROR)");
      if (local_b8.allocated_ == (LogMessageData *)0x0) {
        return;
      }
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x15b,(CheckOpString *)&local_b8);
      google::LogMessage::stream(&outer);
    }
    else {
      local_b8.allocated_ = pLVar10;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x15a,(CheckOpString *)&local_b8);
      google::LogMessage::stream(&outer);
    }
  }
  else {
    local_b8.allocated_ = pLVar10;
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&outer,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
               ,0x159,(CheckOpString *)&local_b8);
    google::LogMessage::stream(&outer);
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&outer);
}

Assistant:

void TestLogging(bool check_counts) {
  int64 base_num_infos = LogMessage::num_messages(GLOG_INFO);
  int64 base_num_warning = LogMessage::num_messages(GLOG_WARNING);
  int64 base_num_errors = LogMessage::num_messages(GLOG_ERROR);

  LOG(INFO) << string("foo ") << "bar " << 10 << ' ' << 3.4;
  for (int i = 0; i < 10; ++i) {
    int old_errno = errno;
    errno = i;
    PLOG_EVERY_N(ERROR, 2) << "Plog every 2, iteration " << COUNTER;
    errno = old_errno;

    LOG_EVERY_N(ERROR, 3) << "Log every 3, iteration " << COUNTER << endl;
    LOG_EVERY_N(ERROR, 4) << "Log every 4, iteration " << COUNTER << endl;

    LOG_IF_EVERY_N(WARNING, true, 5) << "Log if every 5, iteration " << COUNTER;
    LOG_IF_EVERY_N(WARNING, false, 3)
        << "Log if every 3, iteration " << COUNTER;
    LOG_IF_EVERY_N(INFO, true, 1) << "Log if every 1, iteration " << COUNTER;
    LOG_IF_EVERY_N(ERROR, (i < 3), 2)
        << "Log if less than 3 every 2, iteration " << COUNTER;
  }
  LOG_IF(WARNING, true) << "log_if this";
  LOG_IF(WARNING, false) << "don't log_if this";

  char s[] = "array";
  LOG(INFO) << s;
  const char const_s[] = "const array";
  LOG(INFO) << const_s;
  int j = 1000;
  LOG(ERROR) << string("foo") << ' ' << j << ' ' << setw(10) << j << " "
             << setw(1) << hex << j;
  LOG(INFO) << "foo " << std::setw(10) << 1.0;

  {
    google::LogMessage outer(__FILE__, __LINE__, GLOG_ERROR);
    outer.stream() << "outer";

    LOG(ERROR) << "inner";
  }

  LogMessage("foo", LogMessage::kNoLogPrefix, GLOG_INFO).stream()
      << "no prefix";

  if (check_counts) {
    CHECK_EQ(base_num_infos + 15, LogMessage::num_messages(GLOG_INFO));
    CHECK_EQ(base_num_warning + 3, LogMessage::num_messages(GLOG_WARNING));
    CHECK_EQ(base_num_errors + 17, LogMessage::num_messages(GLOG_ERROR));
  }
}